

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_astar.hpp
# Opt level: O2

vector<Tiles::State,_std::allocator<Tiles::State>_> * __thiscall
compress::CompressAstar<Tiles>::search
          (vector<Tiles::State,_std::allocator<Tiles::State>_> *__return_storage_ptr__,
          CompressAstar<Tiles> *this,State *init)

{
  CompressClosedList<Node<Tiles>_> *this_00;
  size_t *psVar1;
  CompressOpenList<Node<Tiles>_> *this_01;
  int newb;
  Tiles *this_02;
  pair<bool,_bool> pVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  State state;
  Node<Tiles> n;
  Node<Tiles> parent;
  char local_50;
  int local_4c;
  State parent_state;
  
  this_01 = &this->open;
  wrap(&parent,this,init,(Node<Tiles> *)0x0,0,-1);
  CompressOpenList<Node<Tiles>_>::push(this_01,&parent);
  if ((this->open).size != 0) {
    this_00 = &this->closed;
    while ((this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
           super__Vector_impl_data._M_finish ==
           (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
           super__Vector_impl_data._M_start) {
      CompressOpenList<Node<Tiles>_>::pop(&n,this_01);
      pVar2 = CompressClosedList<Node<Tiles>_>::find_insert(this_00,&n);
      if (((ushort)pVar2 & 1) == 0) {
LAB_00107659:
        Tiles::unpack((this->super_SearchAlg<Tiles>).dom,&state,n.packed);
        bVar6 = state.h == '\0';
        if (bVar6) {
          std::vector<Tiles::State,_std::allocator<Tiles::State>_>::push_back(&this->path,&state);
          while (n.packed.word != n.parent_packed.word) {
            CompressClosedList<Node<Tiles>_>::trace_parent(&parent,this_00,&n);
            Tiles::unpack((this->super_SearchAlg<Tiles>).dom,&parent_state,parent.packed);
            std::vector<Tiles::State,_std::allocator<Tiles::State>_>::push_back
                      (&this->path,(value_type *)&parent_state);
            n._4_4_ = parent._4_4_;
            n.f = parent.f;
            n.g = parent.g;
            n.pop = parent.pop;
            n._3_1_ = parent._3_1_;
            n.parent_packed.word =
                 CONCAT44(parent.parent_packed.word._4_4_,(int)parent.parent_packed.word);
            n.packed = (PackedState)parent.packed.word;
          }
          CompressClosedList<Node<Tiles>_>::print_statistics(this_00);
          CompressOpenList<Node<Tiles>_>::clear(this_01);
          CompressClosedList<Node<Tiles>_>::clear(this_00);
        }
        else {
          psVar1 = &(this->super_SearchAlg<Tiles>).expd;
          *psVar1 = *psVar1 + 1;
          uVar3 = (ulong)(byte)state.blank;
          lVar5 = 0;
          while( true ) {
            this_02 = (this->super_SearchAlg<Tiles>).dom;
            lVar4 = (long)(char)uVar3 * 0x14;
            if (*(int *)(this_02 + lVar4 + 0x4440) <= lVar5) break;
            newb = *(int *)(this_02 + lVar5 * 4 + lVar4 + 0x4444);
            if (newb != n.pop) {
              psVar1 = &(this->super_SearchAlg<Tiles>).gend;
              *psVar1 = *psVar1 + 1;
              Tiles::apply((Edge<Tiles> *)&parent,this_02,&state,newb);
              wrap((Node<Tiles> *)&parent_state,this,&state,&n,(int)parent.parent_packed.word,
                   parent._4_4_);
              CompressOpenList<Node<Tiles>_>::push(this_01,(Node<Tiles> *)&parent_state);
              state.h = local_50;
              uVar3 = (ulong)local_4c;
              state.tiles[state.blank] = state.tiles[uVar3];
              state.blank = (char)local_4c;
            }
            lVar5 = lVar5 + 1;
          }
        }
      }
      else {
        if (((ushort)pVar2 >> 8 & 1) != 0) {
          psVar1 = &(this->super_SearchAlg<Tiles>).reopd;
          *psVar1 = *psVar1 + 1;
          goto LAB_00107659;
        }
        bVar6 = false;
      }
      if ((bVar6) || ((this->open).size == 0)) break;
    }
  }
  std::vector<Tiles::State,_std::allocator<Tiles::State>_>::vector
            (__return_storage_ptr__,&this->path);
  return __return_storage_ptr__;
}

Assistant:

std::vector<typename D::State> search(typename D::State &init) {
            open.push(wrap(init, nullptr, 0, -1));

            while (!open.isempty() && path.size() == 0) {
                Node<D> n = open.pop();

                bool found, reopened;
                tie(found, reopened) = closed.find_insert(n);
                if (found && reopened) this->reopd++;
                if (found && !reopened) continue;

                typename D::State state;
                this->dom.unpack(state, n.packed);

                if (this->dom.isgoal(state)) {
                    // trace path here
                    path.push_back(state);
                    while(n.packed != n.parent_packed) {
                        Node<D> parent = closed.trace_parent(n);
                        typename D::State parent_state;
                        this->dom.unpack(parent_state, parent.packed);
                        path.push_back(parent_state);
                        n = parent;
                    }
                    closed.print_statistics();
                    open.clear();
                    closed.clear();
                    break;
                }

                this->expd++;
                for (int i = 0; i < this->dom.nops(state); i++) {
                    int op = this->dom.nthop(state, i);
                    if (op == n.pop)
                        continue;
                    this->gend++;
                    Edge<D> e = this->dom.apply(state, op);
                    open.push(wrap(state, &n, e.cost, e.pop));
                    this->dom.undo(state, e);
                }
            }
            return path;
        }